

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_0::AsyncStreamFd::getpeername
          (AsyncStreamFd *this,int __fd,sockaddr *__addr,socklen_t *__len)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_48;
  Fault f;
  SyscallResult local_28;
  undefined4 local_24;
  SyscallResult _kjSyscallResult;
  socklen_t socklen;
  uint *length_local;
  sockaddr *addr_local;
  AsyncStreamFd *this_local;
  
  local_24._0_2_ = __addr->sa_family;
  local_24._2_1_ = __addr->sa_data[0];
  local_24._3_1_ = __addr->sa_data[1];
  f.exception = (Exception *)this;
  __kjSyscallResult = __addr;
  local_28 = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::AsyncStreamFd::getpeername(sockaddr*,unsigned_int*)::_lambda()_1_>
                       ((anon_class_24_3_b9f2bb85 *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_28);
  if (pvVar1 != (void *)0x0) {
    __kjSyscallResult->sa_family = (undefined2)local_24;
    __kjSyscallResult->sa_data[0] = local_24._2_1_;
    __kjSyscallResult->sa_data[1] = local_24._3_1_;
    return (int)__kjSyscallResult;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_28);
  kj::_::Debug::Fault::Fault
            (&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x205,osErrorNumber,"::getpeername(fd, addr, &socklen)","");
  kj::_::Debug::Fault::fatal(&local_48);
}

Assistant:

void getpeername(struct sockaddr* addr, uint* length) override {
    socklen_t socklen = *length;
    KJ_SYSCALL(::getpeername(fd, addr, &socklen));
    *length = socklen;
  }